

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O0

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentOperands
          (LLVMPointerGraphBuilder *this,CallInst *CI,PSNode *node)

{
  bool bVar1;
  Use *this_00;
  Use *val;
  PSNode *this_01;
  PSNode *in_RDI;
  PSNode *operand;
  Use *arg;
  Use *__end2;
  Use *__begin2;
  iterator_range<const_llvm::Use_*> *__range2;
  iterator_range<const_llvm::Use_*> local_30;
  iterator_range<const_llvm::Use_*> *local_20;
  
  local_30 = llvmutils::args((CallInst *)0x1b1b66);
  local_20 = &local_30;
  this_00 = llvm::iterator_range<const_llvm::Use_*>::begin(local_20);
  val = llvm::iterator_range<const_llvm::Use_*>::end(local_20);
  for (; this_00 != val; this_00 = (Use *)((LLVMPointerGraphBuilder *)this_00 + 0x20)) {
    llvm::Use::operator_cast_to_Value_(this_00);
    this_01 = tryGetOperand((LLVMPointerGraphBuilder *)this_00,(Value *)val);
    if (this_01 != (PSNode *)0x0) {
      bVar1 = SubgraphNode<dg::pta::PSNode>::hasOperand
                        ((SubgraphNode<dg::pta::PSNode> *)this_01,in_RDI);
      if (!bVar1) {
        SubgraphNode<dg::pta::PSNode>::addOperand<dg::pta::PSNode*,dg::pta::PSNode>
                  ((SubgraphNode<dg::pta::PSNode> *)this_01,in_RDI);
      }
    }
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentOperands(const llvm::CallInst &CI,
                                                  PSNode &node) {
    for (const auto &arg : llvmutils::args(CI)) {
        PSNode *operand = tryGetOperand(arg);
        if (operand && !node.hasOperand(operand)) {
            node.addOperand(operand);
        }
    }
}